

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QCss::Selector>::emplace<QCss::Selector_const&>
          (QMovableArrayOps<QCss::Selector> *this,qsizetype i,Selector *args)

{
  qsizetype *pqVar1;
  Selector **ppSVar2;
  Selector *pSVar3;
  Data *pDVar4;
  long lVar5;
  Selector *pSVar6;
  Data *pDVar7;
  long in_FS_OFFSET;
  bool bVar8;
  QArrayDataPointer<QCss::BasicSelector> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QCss::Selector>).super_QArrayDataPointer<QCss::Selector>.d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_005faca8:
    local_48.d = (args->basicSelectors).d.d;
    local_48.ptr = (args->basicSelectors).d.ptr;
    local_48.size = (args->basicSelectors).d.size;
    if (local_48.d != (Data *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar8 = (this->super_QGenericArrayOps<QCss::Selector>).super_QArrayDataPointer<QCss::Selector>.
            size != 0;
    QArrayDataPointer<QCss::Selector>::detachAndGrow
              ((QArrayDataPointer<QCss::Selector> *)this,(uint)(i == 0 && bVar8),1,(Selector **)0x0,
               (QArrayDataPointer<QCss::Selector> *)0x0);
    pSVar6 = (this->super_QGenericArrayOps<QCss::Selector>).super_QArrayDataPointer<QCss::Selector>.
             ptr;
    if (i == 0 && bVar8) {
      pSVar6[-1].basicSelectors.d.d = local_48.d;
      pSVar6[-1].basicSelectors.d.ptr = local_48.ptr;
      pSVar6[-1].basicSelectors.d.size = local_48.size;
      (this->super_QGenericArrayOps<QCss::Selector>).super_QArrayDataPointer<QCss::Selector>.ptr =
           pSVar6 + -1;
    }
    else {
      pSVar3 = pSVar6 + i;
      memmove(pSVar3 + 1,pSVar6 + i,
              ((this->super_QGenericArrayOps<QCss::Selector>).
               super_QArrayDataPointer<QCss::Selector>.size - i) * 0x18);
      (pSVar3->basicSelectors).d.d = local_48.d;
      (pSVar3->basicSelectors).d.ptr = local_48.ptr;
      (pSVar3->basicSelectors).d.size = local_48.size;
    }
    local_48.size = 0;
    local_48.ptr = (BasicSelector *)0x0;
    local_48.d = (Data *)0x0;
    pqVar1 = &(this->super_QGenericArrayOps<QCss::Selector>).super_QArrayDataPointer<QCss::Selector>
              .size;
    *pqVar1 = *pqVar1 + 1;
    QArrayDataPointer<QCss::BasicSelector>::~QArrayDataPointer(&local_48);
  }
  else {
    lVar5 = (this->super_QGenericArrayOps<QCss::Selector>).super_QArrayDataPointer<QCss::Selector>.
            size;
    if ((lVar5 == i && pDVar4 != (Data *)0x0) &&
       ((pDVar4->super_QArrayData).alloc - lVar5 !=
        ((long)((long)(this->super_QGenericArrayOps<QCss::Selector>).
                      super_QArrayDataPointer<QCss::Selector>.ptr -
               ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        -0x5555555555555555)) {
      pSVar6 = (this->super_QGenericArrayOps<QCss::Selector>).
               super_QArrayDataPointer<QCss::Selector>.ptr;
      pDVar7 = (args->basicSelectors).d.d;
      pSVar6[lVar5].basicSelectors.d.d = pDVar7;
      pSVar6[lVar5].basicSelectors.d.ptr = (args->basicSelectors).d.ptr;
      pSVar6[lVar5].basicSelectors.d.size = (args->basicSelectors).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
    }
    else {
      if (((i != 0) || (pDVar4 == (Data *)0x0)) ||
         ((Selector *)((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
          == (this->super_QGenericArrayOps<QCss::Selector>).super_QArrayDataPointer<QCss::Selector>.
             ptr)) goto LAB_005faca8;
      pSVar6 = (this->super_QGenericArrayOps<QCss::Selector>).
               super_QArrayDataPointer<QCss::Selector>.ptr;
      pDVar7 = (args->basicSelectors).d.d;
      pSVar6[-1].basicSelectors.d.d = pDVar7;
      pSVar6[-1].basicSelectors.d.ptr = (args->basicSelectors).d.ptr;
      pSVar6[-1].basicSelectors.d.size = (args->basicSelectors).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      ppSVar2 = &(this->super_QGenericArrayOps<QCss::Selector>).
                 super_QArrayDataPointer<QCss::Selector>.ptr;
      *ppSVar2 = *ppSVar2 + -1;
    }
    pqVar1 = &(this->super_QGenericArrayOps<QCss::Selector>).super_QArrayDataPointer<QCss::Selector>
              .size;
    *pqVar1 = *pqVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }